

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

string * __thiscall
tinyusdz::ascii::AsciiParser::GetError_abi_cxx11_(string *__return_storage_ptr__,AsciiParser *this)

{
  bool bVar1;
  reference pvVar2;
  ostream *poVar3;
  size_type sVar4;
  undefined1 local_1c8 [8];
  ErrorDiagnostic diag;
  stringstream ss;
  ostream aoStack_190 [376];
  AsciiParser *local_18;
  AsciiParser *this_local;
  
  local_18 = this;
  this_local = (AsciiParser *)__return_storage_ptr__;
  bVar1 = ::std::
          stack<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>_>
          ::empty(&this->err_stack);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    ::std::__cxx11::stringstream::stringstream((stringstream *)&diag.cursor);
    while( true ) {
      bVar1 = ::std::
              stack<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>_>
              ::empty(&this->err_stack);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pvVar2 = ::std::
               stack<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>_>
               ::top(&this->err_stack);
      ErrorDiagnostic::ErrorDiagnostic((ErrorDiagnostic *)local_1c8,pvVar2);
      poVar3 = ::std::operator<<(aoStack_190,"err_stack[");
      sVar4 = ::std::
              stack<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>_>
              ::size(&this->err_stack);
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar4 - 1);
      poVar3 = ::std::operator<<(poVar3,"] USDA source near line ");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,diag.err.field_2._8_4_ + 1);
      poVar3 = ::std::operator<<(poVar3,", col ");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,diag.err.field_2._12_4_ + 1);
      ::std::operator<<(poVar3,": ");
      ::std::operator<<(aoStack_190,(string *)local_1c8);
      ::std::
      stack<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>_>
      ::pop(&this->err_stack);
      ErrorDiagnostic::~ErrorDiagnostic((ErrorDiagnostic *)local_1c8);
    }
    ::std::__cxx11::stringstream::str();
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&diag.cursor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AsciiParser::GetError() {
  if (err_stack.empty()) {
    return std::string();
  }

  std::stringstream ss;
  while (!err_stack.empty()) {
    ErrorDiagnostic diag = err_stack.top();

    ss << "err_stack[" << (err_stack.size() - 1) << "] USDA source near line "
       << (diag.cursor.row + 1) << ", col " << (diag.cursor.col + 1) << ": ";
    ss << diag.err;  // assume message contains newline.

    err_stack.pop();
  }

  return ss.str();
}